

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.h
# Opt level: O1

void * __thiscall
JsUtil::Stack<void_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::Pop
          (Stack<void_*,_Memory::ArenaAllocator,_false,_DefaultComparer> *this)

{
  Type pvVar1;
  Type *ppvVar2;
  
  ppvVar2 = List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Item
                      (&this->list,
                       (this->list).
                       super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>.count +
                       -1);
  pvVar1 = *ppvVar2;
  Js::
  CopyRemovePolicy<JsUtil::List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
  ::RemoveAt((CopyRemovePolicy<JsUtil::List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
              *)&(this->list).field_0x28,&this->list,
             (this->list).super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>.count
             + -1);
  return pvVar1;
}

Assistant:

T Pop()
        {
            T item = list.Item(list.Count() - 1);
            list.RemoveAt(list.Count() - 1);
            return item;
        }